

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestCase * __thiscall testing::UnitTest::GetTestCase(UnitTest *this,int i)

{
  long lVar1;
  UnitTestImpl *this_00;
  TestCase *pTVar2;
  long in_FS_OFFSET;
  int i_local;
  UnitTest *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = impl(this);
  pTVar2 = internal::UnitTestImpl::GetTestCase(this_00,i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pTVar2;
  }
  __stack_chk_fail();
}

Assistant:

const TestCase* UnitTest::GetTestCase(int i) const {
  return impl()->GetTestCase(i);
}